

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

void __thiscall
zmq::routing_socket_base_t::xwrite_activated(routing_socket_base_t *this,pipe_t *pipe_)

{
  bool bVar1;
  pointer ppVar2;
  pipe_t *in_RSI;
  _Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_> *in_RDI;
  iterator it;
  iterator end;
  map<zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
  *in_stack_ffffffffffffffc8;
  _Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_> local_20;
  _Self local_18;
  pipe_t *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
       ::end(in_stack_ffffffffffffffc8);
  std::_Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>::
  _Rb_tree_iterator(&local_20);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while ((bVar1 = std::operator!=(&local_20,&local_18), bVar1 &&
         (ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
                                 *)0x206d22), (ppVar2->second).pipe != local_10))) {
    std::_Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>::
    operator++(in_RDI);
  }
  bVar1 = std::operator!=(&local_20,&local_18);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it != end",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
            ,0x837);
    fflush(_stderr);
    zmq_abort((char *)0x206d9d);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
                         *)0x206dab);
  if (((ppVar2->second).active & 1U) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!it->second.active",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
            ,0x838);
    fflush(_stderr);
    zmq_abort((char *)0x206dff);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
                         *)0x206e0b);
  (ppVar2->second).active = true;
  return;
}

Assistant:

void zmq::routing_socket_base_t::xwrite_activated (pipe_t *pipe_)
{
    const out_pipes_t::iterator end = _out_pipes.end ();
    out_pipes_t::iterator it;
    for (it = _out_pipes.begin (); it != end; ++it)
        if (it->second.pipe == pipe_)
            break;

    zmq_assert (it != end);
    zmq_assert (!it->second.active);
    it->second.active = true;
}